

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_CreateTest_InvalidValueTooManyMipLevels_Test::TestBody
          (ktxTexture1_CreateTest_InvalidValueTooManyMipLevels_Test *this)

{
  bool bVar1;
  Type type;
  AssertHelper *this_00;
  long in_RDI;
  Message *in_stack_00000028;
  AssertHelper *in_stack_00000030;
  AssertionResult gtest_ar;
  ktxTexture1 *texture;
  ktx_error_code_e *in_stack_ffffffffffffffb0;
  ktx_error_code_e *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  AssertHelper *in_stack_ffffffffffffffe0;
  undefined8 local_10 [2];
  
  local_10[0] = 0;
  *(int *)(*(long *)(in_RDI + 0x188) + 0x20) = *(int *)(*(long *)(in_RDI + 0x188) + 0x20) + 1;
  type = ktxTexture1_Create(*(undefined8 *)(in_RDI + 0x188),0,local_10);
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffe0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x130113)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffe0,type,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc0);
    testing::internal::AssertHelper::operator=(in_stack_00000030,in_stack_00000028);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x130161);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1301b1);
  return;
}

Assistant:

TEST_F(ktxTexture1_CreateTest, InvalidValueTooManyMipLevels) {
    ktxTexture1* texture = 0;

    createInfo.numLevels += 1;

    EXPECT_EQ(ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE, &texture),
              KTX_INVALID_OPERATION);
}